

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

ON_2dPoint __thiscall ON_SubDFaceParameter::QuadFaceParameters(ON_SubDFaceParameter *this)

{
  ON_2dPoint OVar1;
  bool bVar2;
  uint uVar3;
  ON_SubDFaceParameter *this_local;
  double local_10;
  
  bVar2 = IsSet(this);
  if ((bVar2) && (bVar2 = ON_SubDFaceCornerDex::IsQuadFace(&this->m_cdex), bVar2)) {
    uVar3 = ON_SubDFaceCornerDex::CornerIndex(&this->m_cdex);
    switch(uVar3) {
    case 0:
      ON_2dPoint::ON_2dPoint((ON_2dPoint *)&this_local,this->m_s,this->m_t);
      break;
    case 1:
      ON_2dPoint::ON_2dPoint((ON_2dPoint *)&this_local,1.0 - this->m_t,this->m_s);
      break;
    case 2:
      ON_2dPoint::ON_2dPoint((ON_2dPoint *)&this_local,1.0 - this->m_s,1.0 - this->m_t);
      break;
    case 3:
      ON_2dPoint::ON_2dPoint((ON_2dPoint *)&this_local,this->m_t,1.0 - this->m_s);
      break;
    default:
      goto switchD_008d51ee_default;
    }
  }
  else {
switchD_008d51ee_default:
    this_local = (ON_SubDFaceParameter *)ON_2dPoint::NanPoint.x;
    local_10 = ON_2dPoint::NanPoint.y;
  }
  OVar1.y = local_10;
  OVar1.x = (double)this_local;
  return OVar1;
}

Assistant:

const ON_2dPoint ON_SubDFaceParameter::QuadFaceParameters() const
{
  if (IsSet() && m_cdex.IsQuadFace())
  {
    switch (m_cdex.CornerIndex())
    {
    case 0:
      return ON_2dPoint(m_s, m_t);
      break;
    case 1:
      return ON_2dPoint(1.0 - m_t, m_s);
      break;
    case 2:
      return ON_2dPoint(1.0 - m_s, 1.0 - m_t);
      break;
    case 3:
      return ON_2dPoint(m_t, 1.0 - m_s);
      break;
    }
  }
  return ON_2dPoint::NanPoint;
}